

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O1

String * axl::io::getCurrentDir(void)

{
  char *p;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  
  p = get_current_dir_name();
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase(in_RDI,p,0xffffffffffffffff);
  free(p);
  return in_RDI;
}

Assistant:

sl::String
getCurrentDir() {
#if (_AXL_OS_WIN)
	wchar_t dir[1024] = { 0 };
	::GetCurrentDirectoryW(countof(dir) - 1, dir);
	return dir;
#elif (_AXL_OS_POSIX)
	char* p = ::get_current_dir_name();
	sl::String dir = p;
	::free(p);
	return dir;
#endif
}